

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,VoidCastedCallStatementSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  SubroutineKind SVar3;
  undefined4 extraout_var;
  ExpressionStatement *stmt;
  Statement *pSVar4;
  Diagnostic *this_00;
  string_view arg;
  SourceRange local_30;
  CallExpression *this;
  
  iVar2 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,0x100);
  this = (CallExpression *)CONCAT44(extraout_var,iVar2);
  local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)this,&local_30);
  bVar1 = Expression::bad((Expression *)this);
  if (!bVar1) {
    if (((this->super_Expression).kind == Call) &&
       ((SVar3 = CallExpression::getSubroutineKind(this), SVar3 != Task ||
        (bVar1 = Type::isVoid((this->super_Expression).type.ptr), !bVar1)))) {
      bVar1 = Type::isVoid((this->super_Expression).type.ptr);
      if (!bVar1) {
        return &stmt->super_Statement;
      }
      this_00 = ASTContext::addDiag(context,(DiagCode)0x5c0008,(this->super_Expression).sourceRange)
      ;
      arg = CallExpression::getSubroutineName(this);
      Diagnostic::operator<<(this_00,arg);
      return &stmt->super_Statement;
    }
    ASTContext::addDiag(context,(DiagCode)0x510008,(this->super_Expression).sourceRange);
  }
  pSVar4 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar4;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const VoidCastedCallStatementSyntax& syntax,
                                           const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.expr, context, ASTFlags::TopLevelStatement);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    if (expr.kind != ExpressionKind::Call ||
        (expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task &&
         expr.type->isVoid())) {
        context.addDiag(diag::VoidCastFuncCall, expr.sourceRange);
        return badStmt(compilation, result);
    }

    if (expr.type->isVoid()) {
        context.addDiag(diag::PointlessVoidCast, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
    }

    return *result;
}